

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingBuffer.h
# Opt level: O1

void __thiscall Deque<int,_std::allocator<int>_>::level_down(Deque<int,_std::allocator<int>_> *this)

{
  ulong uVar1;
  DataBlock **ppDVar2;
  DataBlock **ppDVar3;
  DataBlock **ppDVar4;
  DataBlock **ppDVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  DataBlock **ppDVar10;
  DataBlock **__tmp;
  DataBlock **__tmp_1;
  unsigned_long __tmp_3;
  DataBlock **__tmp_2;
  unsigned_long __tmp_4;
  
  uVar1 = (this->small_).allocSize_;
  if (uVar1 < 8) {
    return;
  }
  ppDVar2 = (this->big_).arr_;
  ppDVar3 = (this->big_).begin_;
  ppDVar4 = (this->current_).arr_;
  ppDVar5 = (this->current_).begin_;
  (this->current_).arr_ = ppDVar2;
  (this->current_).begin_ = ppDVar3;
  (this->big_).arr_ = ppDVar4;
  (this->big_).begin_ = ppDVar5;
  ppDVar4 = (this->current_).end_;
  ppDVar5 = (this->big_).end_;
  (this->current_).end_ = ppDVar5;
  (this->big_).end_ = ppDVar4;
  sVar6 = (this->big_).size_;
  sVar7 = (this->big_).allocSize_;
  sVar8 = (this->current_).size_;
  sVar9 = (this->current_).allocSize_;
  (this->current_).size_ = sVar6;
  (this->current_).allocSize_ = sVar7;
  (this->big_).size_ = sVar8;
  (this->big_).allocSize_ = sVar9;
  ppDVar4 = (this->small_).arr_;
  ppDVar10 = (this->small_).begin_;
  (this->small_).arr_ = ppDVar2;
  (this->current_).arr_ = ppDVar4;
  (this->current_).begin_ = ppDVar10;
  (this->small_).begin_ = ppDVar3;
  (this->current_).end_ = (this->small_).end_;
  (this->small_).end_ = ppDVar5;
  (this->current_).size_ = (this->small_).size_;
  (this->small_).size_ = sVar6;
  (this->current_).allocSize_ = uVar1;
  (this->small_).allocSize_ = sVar7;
  RingBuffer<Deque<int,_std::allocator<int>_>::DataBlock_*,_std::allocator<Deque<int,_std::allocator<int>_>::DataBlock_*>_>
  ::reset_and_resize(&this->small_,uVar1 >> 1);
  return;
}

Assistant:

std::size_t max_size() const {
        return allocSize_;
    }